

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::VerifyExecutionModeLimits(FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x339,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) goto LAB_0078b730;
    *puVar3 = 0;
  }
  if ((uint)this->profilingInterpreter1Limit + (uint)this->simpleJitLimit +
      (uint)this->autoProfilingInterpreter1Limit + (uint)this->profilingInterpreter0Limit +
      (uint)this->autoProfilingInterpreter0Limit + (uint)this->interpreterLimit !=
      (uint)this->fullJitThreshold) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x342,
                                "(( interpreterLimit + autoProfilingInterpreter0Limit + profilingInterpreter0Limit + autoProfilingInterpreter1Limit + simpleJitLimit + profilingInterpreter1Limit ) == fullJitThreshold)"
                                ,
                                "( interpreterLimit + autoProfilingInterpreter0Limit + profilingInterpreter0Limit + autoProfilingInterpreter1Limit + simpleJitLimit + profilingInterpreter1Limit ) == fullJitThreshold"
                               );
    if (!bVar2) {
LAB_0078b730:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::VerifyExecutionModeLimits() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(
            (
                interpreterLimit +
                autoProfilingInterpreter0Limit +
                profilingInterpreter0Limit +
                autoProfilingInterpreter1Limit +
                simpleJitLimit +
                profilingInterpreter1Limit
                ) == fullJitThreshold);
    }